

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModel.h
# Opt level: O2

HighsStatus __thiscall
Highs::getDualObjectiveValue(Highs *this,double *dual_objective_function_value)

{
  bool bVar1;
  
  if ((this->model_).hessian_.dim_ != 0) {
    return kError;
  }
  bVar1 = computeDualObjectiveValue
                    (&(this->model_).lp_,&this->solution_,dual_objective_function_value);
  return (uint)bVar1 + kError;
}

Assistant:

bool isQp() const { return (this->hessian_.dim_ != 0); }